

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O0

string * RccGetExecutable(string *__return_storage_ptr__,cmGeneratorTarget *target,
                         string *qtMajorVersion)

{
  cmLocalGenerator *pcVar1;
  bool bVar2;
  cmGeneratorTarget *pcVar3;
  char *pcVar4;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  cmGeneratorTarget *local_a0;
  cmGeneratorTarget *qt4Rcc;
  string local_90;
  allocator local_69;
  string local_68;
  cmGeneratorTarget *local_48;
  cmGeneratorTarget *qt5Rcc;
  cmLocalGenerator *local_30;
  cmLocalGenerator *lg;
  string *local_20;
  string *qtMajorVersion_local;
  cmGeneratorTarget *target_local;
  string *rccExec;
  
  lg._7_1_ = 0;
  local_20 = qtMajorVersion;
  qtMajorVersion_local = (string *)target;
  target_local = (cmGeneratorTarget *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_30 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)qtMajorVersion_local);
  bVar2 = std::operator==(local_20,"5");
  pcVar1 = local_30;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_68,"Qt5::rcc",&local_69);
    pcVar3 = cmLocalGenerator::FindGeneratorTargetToUse(pcVar1,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    local_48 = pcVar3;
    if (pcVar3 == (cmGeneratorTarget *)0x0) {
      cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)qtMajorVersion_local);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Error("Qt5::rcc target not found ",pcVar4,(char *)0x0,(char *)0x0);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_90,"",(allocator *)((long)&qt4Rcc + 7));
      pcVar4 = cmGeneratorTarget::ImportedGetLocation(pcVar3,&local_90);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,pcVar4);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator((allocator<char> *)((long)&qt4Rcc + 7));
    }
  }
  else {
    bVar2 = std::operator==(local_20,"4");
    pcVar1 = local_30;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_c0,"Qt4::rcc",&local_c1);
      pcVar3 = cmLocalGenerator::FindGeneratorTargetToUse(pcVar1,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      local_a0 = pcVar3;
      if (pcVar3 == (cmGeneratorTarget *)0x0) {
        cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)qtMajorVersion_local);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmSystemTools::Error("Qt4::rcc target not found ",pcVar4,(char *)0x0,(char *)0x0);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_e8,"",&local_e9);
        pcVar4 = cmGeneratorTarget::ImportedGetLocation(pcVar3,&local_e8);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,pcVar4);
        std::__cxx11::string::~string((string *)&local_e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_e9);
      }
    }
    else {
      cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)qtMajorVersion_local);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Error
                ("The CMAKE_AUTORCC feature supports only Qt 4 and Qt 5 ",pcVar4,(char *)0x0,
                 (char *)0x0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string RccGetExecutable(cmGeneratorTarget const* target,
                                    const std::string& qtMajorVersion)
{
  std::string rccExec;
  cmLocalGenerator* lg = target->GetLocalGenerator();
  if (qtMajorVersion == "5") {
    cmGeneratorTarget* qt5Rcc = lg->FindGeneratorTargetToUse("Qt5::rcc");
    if (qt5Rcc != CM_NULLPTR) {
      rccExec = qt5Rcc->ImportedGetLocation("");
    } else {
      cmSystemTools::Error("Qt5::rcc target not found ",
                           target->GetName().c_str());
    }
  } else if (qtMajorVersion == "4") {
    cmGeneratorTarget* qt4Rcc = lg->FindGeneratorTargetToUse("Qt4::rcc");
    if (qt4Rcc != CM_NULLPTR) {
      rccExec = qt4Rcc->ImportedGetLocation("");
    } else {
      cmSystemTools::Error("Qt4::rcc target not found ",
                           target->GetName().c_str());
    }
  } else {
    cmSystemTools::Error(
      "The CMAKE_AUTORCC feature supports only Qt 4 and Qt 5 ",
      target->GetName().c_str());
  }
  return rccExec;
}